

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_udunits.cpp
# Opt level: O3

void __thiscall UDUNITS_acceptedAlias_Test::TestBody(UDUNITS_acceptedAlias_Test *this)

{
  char cVar1;
  bool bVar2;
  XMLError XVar3;
  int iVar4;
  XMLElement *pXVar5;
  char *pcVar6;
  uint64_t uVar7;
  XMLElement *pXVar8;
  size_t sVar9;
  ostream *poVar10;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  unit uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  precise_unit pVar14;
  int failConvert;
  string def;
  XMLDocument doc;
  unit local_400;
  AssertHelper local_3f8;
  undefined1 local_3f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  double local_3d0;
  unit local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c0;
  long local_3b8 [2];
  XMLElement *local_3a8;
  string local_3a0;
  XMLElement *local_380;
  string local_378;
  string local_358;
  XMLDocument local_338;
  
  tinyxml2::XMLDocument::XMLDocument(&local_338,true,PRESERVE_WHITESPACE);
  XVar3 = tinyxml2::XMLDocument::LoadFile
                    (&local_338,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/UDUNITS2/udunits2-accepted.xml"
                    );
  local_3c8.multiplier_._0_1_ = XVar3 == XML_SUCCESS;
  local_3c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (XVar3 == XML_SUCCESS) {
    pXVar5 = tinyxml2::XMLNode::FirstChildElement(&local_338.super_XMLNode,"unit-system");
    pXVar5 = tinyxml2::XMLNode::FirstChildElement(&pXVar5->super_XMLNode,"unit");
    local_3f8.data_._0_4_ = 0;
    if (pXVar5 != (XMLElement *)0x0) {
      do {
        local_3a8 = pXVar5;
        pXVar5 = tinyxml2::XMLNode::FirstChildElement(&pXVar5->super_XMLNode,"def");
        pcVar6 = tinyxml2::XMLNode::Value((pXVar5->super_XMLNode)._firstChild);
        std::__cxx11::string::string((string *)local_3f0,pcVar6,(allocator *)&local_3c8);
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a0,CONCAT71(local_3f0._1_7_,local_3f0[0]),
                   (long)&(local_3e8->_M_dataplus)._M_p + CONCAT71(local_3f0._1_7_,local_3f0[0]));
        uVar7 = units::getDefaultFlags();
        pVar14 = units::unit_from_string(&local_3a0,uVar7);
        local_3d0 = pVar14.multiplier_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
        }
        pXVar5 = tinyxml2::XMLNode::FirstChildElement(&local_3a8->super_XMLNode,"aliases");
        if (pXVar5 == (XMLElement *)0x0) {
          pXVar5 = tinyxml2::XMLNode::NextSiblingElement(&local_3a8->super_XMLNode,"unit");
        }
        else {
          local_380 = pXVar5;
          pXVar5 = tinyxml2::XMLNode::FirstChildElement(&pXVar5->super_XMLNode,"name");
          uVar11 = (unit)((ulong)(uint)(float)local_3d0 | pVar14._8_8_ << 0x20);
          for (; pXVar5 != (XMLElement *)0x0;
              pXVar5 = tinyxml2::XMLNode::NextSiblingElement(&pXVar5->super_XMLNode,"name")) {
            pXVar8 = tinyxml2::XMLNode::FirstChildElement(&pXVar5->super_XMLNode,"singular");
            pcVar6 = tinyxml2::XMLNode::Value((pXVar8->super_XMLNode)._firstChild);
            std::__cxx11::string::string((string *)&local_358,pcVar6,(allocator *)&local_3c8);
            uVar7 = units::getDefaultFlags();
            pVar14 = units::unit_from_string(&local_358,uVar7);
            uVar12 = pVar14.multiplier_._0_4_;
            uVar13 = pVar14.multiplier_._4_4_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              local_3d0 = pVar14.multiplier_;
              operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1
                             );
              uVar12 = SUB84(local_3d0,0);
              uVar13 = (undefined4)((ulong)local_3d0 >> 0x20);
            }
            if ((pVar14._8_8_ & 0xffffffff) == 0xfa94a488 ||
                (NAN((double)CONCAT44(uVar13,uVar12)) || NAN((double)CONCAT44(uVar13,uVar12)))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"unable to convert ",0x12);
              if (pcVar6 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1bf430);
              }
              else {
                sVar9 = strlen(pcVar6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar6,sVar9);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," into a valid unit def=",0x17);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   (char *)CONCAT71(local_3f0._1_7_,local_3f0[0]),(long)local_3e8);
              local_3c8.multiplier_._0_1_ = 10;
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_3c8,1);
LAB_0012a386:
              local_3f8.data_._0_4_ = (int)local_3f8.data_ + 1;
            }
            else {
              local_3c8 = (unit)((ulong)(uint)(float)(double)CONCAT44(uVar13,uVar12) |
                                pVar14._8_8_ << 0x20);
              local_400 = uVar11;
              bVar2 = units::unit::operator==(&local_3c8,&local_400);
              if (!bVar2) {
                std::__cxx11::string::string((string *)&local_3c8,pcVar6,(allocator *)&local_400);
                iVar4 = std::__cxx11::string::compare((char *)&local_3c8);
                if (local_3c8 != (unit)local_3b8) {
                  operator_delete((void *)local_3c8,local_3b8[0] + 1);
                }
                if (iVar4 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"name and unit do not match ",0x1b);
                  if (pcVar6 == (char *)0x0) {
                    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1bf430);
                  }
                  else {
                    sVar9 = strlen(pcVar6);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,pcVar6,sVar9);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout," and ",5);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       (char *)CONCAT71(local_3f0._1_7_,local_3f0[0]),
                                       (long)local_3e8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                  goto LAB_0012a386;
                }
              }
            }
          }
          for (pXVar5 = tinyxml2::XMLNode::FirstChildElement(&local_380->super_XMLNode,"symbol");
              pXVar5 != (XMLElement *)0x0;
              pXVar5 = tinyxml2::XMLNode::NextSiblingElement(&pXVar5->super_XMLNode,"symbol")) {
            pcVar6 = tinyxml2::XMLNode::Value((pXVar5->super_XMLNode)._firstChild);
            std::__cxx11::string::string((string *)&local_378,pcVar6,(allocator *)&local_3c8);
            uVar7 = units::getDefaultFlags();
            pVar14 = units::unit_from_string(&local_378,uVar7);
            uVar12 = pVar14.multiplier_._0_4_;
            uVar13 = pVar14.multiplier_._4_4_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              local_3d0 = pVar14.multiplier_;
              operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1
                             );
              uVar12 = SUB84(local_3d0,0);
              uVar13 = (undefined4)((ulong)local_3d0 >> 0x20);
            }
            if ((pVar14._8_8_ & 0xffffffff) == 0xfa94a488 ||
                (NAN((double)CONCAT44(uVar13,uVar12)) || NAN((double)CONCAT44(uVar13,uVar12)))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"unable to convert ",0x12);
              if (pcVar6 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1bf430);
              }
              else {
                sVar9 = strlen(pcVar6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar6,sVar9);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," into a valid unit def=",0x17);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   (char *)CONCAT71(local_3f0._1_7_,local_3f0[0]),(long)local_3e8);
              local_3c8.multiplier_._0_1_ = 10;
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_3c8,1);
LAB_0012a5cc:
              local_3f8.data_._0_4_ = (int)local_3f8.data_ + 1;
            }
            else {
              local_3c8 = (unit)((ulong)(uint)(float)(double)CONCAT44(uVar13,uVar12) |
                                pVar14._8_8_ << 0x20);
              local_400 = uVar11;
              bVar2 = units::unit::operator==(&local_3c8,&local_400);
              if (!bVar2) {
                std::__cxx11::string::string((string *)&local_3c8,pcVar6,(allocator *)&local_400);
                iVar4 = std::__cxx11::string::compare((char *)&local_3c8);
                if (local_3c8 != (unit)local_3b8) {
                  operator_delete((void *)local_3c8,local_3b8[0] + 1);
                }
                if (iVar4 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"name and unit do not match ",0x1b);
                  if (pcVar6 == (char *)0x0) {
                    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1bf430);
                  }
                  else {
                    sVar9 = strlen(pcVar6);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,pcVar6,sVar9);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout," and ",5);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       (char *)CONCAT71(local_3f0._1_7_,local_3f0[0]),
                                       (long)local_3e8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                  goto LAB_0012a5cc;
                }
              }
            }
          }
          pXVar5 = tinyxml2::XMLNode::NextSiblingElement(&local_3a8->super_XMLNode,"unit");
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_3f0._1_7_,local_3f0[0]) != &local_3e0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_3f0._1_7_,local_3f0[0]),
                          local_3e0._M_allocated_capacity + 1);
        }
      } while (pXVar5 != (XMLElement *)0x0);
    }
    local_3c8 = (unit)((ulong)local_3c8 & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_3f0,"failConvert","0",(int *)&local_3f8,(int *)&local_3c8);
    if (local_3f0[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_3c8);
      if (local_3e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_3e8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_400,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
                 ,0x87,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_400,(Message *)&local_3c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_400);
      if (local_3c8 != (unit)0x0) {
        (**(code **)(*(long *)local_3c8 + 8))();
      }
    }
    if (local_3e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0012a6de;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_3e8;
  }
  else {
    testing::Message::Message((Message *)&local_400);
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_3c0;
    std::ostream::operator<<((ostream *)((long)local_400 + 0x10),XVar3);
    cVar1 = local_400.multiplier_._0_1_ + '\x10';
    std::ios::widen((char)*(undefined8 *)(*(long *)((long)local_400 + 0x10) + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f0,(internal *)&local_3c8,(AssertionResult *)0x17f8e8,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3f8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
               ,0x4f,(char *)CONCAT71(local_3f0._1_7_,local_3f0[0]));
    testing::internal::AssertHelper::operator=(&local_3f8,(Message *)&local_400);
    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_3f0._1_7_,local_3f0[0]) != &local_3e0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_3f0._1_7_,local_3f0[0]),local_3e0._M_allocated_capacity + 1)
      ;
    }
    if (local_400 != (unit)0x0) {
      (**(code **)(*(long *)local_400 + 8))();
    }
    local_3e8 = local_3c0;
    if (local_3c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0012a6de;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_3e8);
LAB_0012a6de:
  tinyxml2::XMLDocument::~XMLDocument(&local_338);
  return;
}

Assistant:

TEST(UDUNITS, acceptedAlias)
{
    tinyxml2::XMLDocument doc;
    auto err = doc.LoadFile(TEST_FILE_FOLDER "/UDUNITS2/udunits2-accepted.xml");
    ASSERT_FALSE(err) << err << std::endl;
    auto cs = doc.FirstChildElement("unit-system")->FirstChildElement("unit");
    int failConvert{0};
    while (cs != nullptr) {
        std::string def = cs->FirstChildElement("def")->FirstChild()->Value();

        auto definitionUnit = units::unit_from_string(def);

        auto alias = cs->FirstChildElement("aliases");
        if (!alias) {
            cs = cs->NextSiblingElement("unit");
            continue;
        }
        auto name = alias->FirstChildElement("name");
        while (name != nullptr) {
            auto sname =
                name->FirstChildElement("singular")->FirstChild()->Value();
            auto nameUnit = units::unit_from_string(sname);
            if (is_error(nameUnit)) {
                std::cout << "unable to convert " << sname
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (unit_cast(nameUnit) != unit_cast(definitionUnit)) {
                    if (std::string(sname) != "gal") {
                        std::cout << "name and unit do not match " << sname
                                  << " and " << def << "\n";
                        ++failConvert;
                    }
                }
            }
            name = name->NextSiblingElement("name");
        }
        // check for symbols
        auto sym = alias->FirstChildElement("symbol");
        while (sym != nullptr) {
            auto symString = sym->FirstChild()->Value();
            auto symUnit = units::unit_from_string(symString);
            if (is_error(symUnit)) {
                std::cout << "unable to convert " << symString
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (unit_cast(symUnit) != unit_cast(definitionUnit)) {
                    if (std::string(symString) != "a") {
                        std::cout << "name and unit do not match " << symString
                                  << " and " << def << "\n";
                        ++failConvert;
                    }
                }
            }
            sym = sym->NextSiblingElement("symbol");
        }

        cs = cs->NextSiblingElement("unit");
    }
    EXPECT_EQ(failConvert, 0);
}